

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void finish(lda *ld)

{
  pointer piVar1;
  float *pfVar2;
  example **__ptr;
  int *__ptr_00;
  
  piVar1 = (ld->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pfVar2 = (ld->Elogtheta)._begin;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
  }
  (ld->Elogtheta)._begin = (float *)0x0;
  (ld->Elogtheta)._end = (float *)0x0;
  (ld->Elogtheta).end_array = (float *)0x0;
  pfVar2 = (ld->decay_levels)._begin;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
  }
  (ld->decay_levels)._begin = (float *)0x0;
  (ld->decay_levels)._end = (float *)0x0;
  (ld->decay_levels).end_array = (float *)0x0;
  pfVar2 = (ld->total_new)._begin;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
  }
  (ld->total_new)._begin = (float *)0x0;
  (ld->total_new)._end = (float *)0x0;
  (ld->total_new).end_array = (float *)0x0;
  __ptr = (ld->examples)._begin;
  if (__ptr != (example **)0x0) {
    free(__ptr);
  }
  (ld->examples)._begin = (example **)0x0;
  (ld->examples)._end = (example **)0x0;
  (ld->examples).end_array = (example **)0x0;
  pfVar2 = (ld->total_lambda)._begin;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
  }
  (ld->total_lambda)._begin = (float *)0x0;
  (ld->total_lambda)._end = (float *)0x0;
  (ld->total_lambda).end_array = (float *)0x0;
  __ptr_00 = (ld->doc_lengths)._begin;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  (ld->doc_lengths)._begin = (int *)0x0;
  (ld->doc_lengths)._end = (int *)0x0;
  (ld->doc_lengths).end_array = (int *)0x0;
  pfVar2 = (ld->digammas)._begin;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
  }
  (ld->digammas)._begin = (float *)0x0;
  (ld->digammas)._end = (float *)0x0;
  (ld->digammas).end_array = (float *)0x0;
  pfVar2 = (ld->v)._begin;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
  }
  (ld->v)._begin = (float *)0x0;
  (ld->v)._end = (float *)0x0;
  (ld->v).end_array = (float *)0x0;
  return;
}

Assistant:

void finish(lda &ld)
{
  ld.sorted_features.~vector<index_feature>();
  ld.Elogtheta.delete_v();
  ld.decay_levels.delete_v();
  ld.total_new.delete_v();
  ld.examples.delete_v();
  ld.total_lambda.delete_v();
  ld.doc_lengths.delete_v();
  ld.digammas.delete_v();
  ld.v.delete_v();
}